

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::OneMinusTessCoordComponentCase::
tessEvalOutputComponentStatements_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *tessCoordComponentName,
          char *outputComponentName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *outputComponentName_local;
  char *tessCoordComponentName_local;
  OneMinusTessCoordComponentCase *this_local;
  
  local_28 = outputComponentName;
  outputComponentName_local = tessCoordComponentName;
  tessCoordComponentName_local = (char *)this;
  this_local = (OneMinusTessCoordComponentCase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_108);
  std::operator+(&local_e8,&local_108,"\t{\n\t\tfloat oneMinusComp = 1.0 - ");
  std::operator+(&local_c8,&local_e8,outputComponentName_local);
  std::operator+(&local_a8,&local_c8,";\n\t\t");
  std::operator+(&local_88,&local_a8,local_28);
  std::operator+(&local_68,&local_88," = ");
  std::operator+(&local_48,&local_68,outputComponentName_local);
  std::operator+(__return_storage_ptr__,&local_48," + oneMinusComp;\n\t}\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

virtual string tessEvalOutputComponentStatements (const char* tessCoordComponentName, const char* outputComponentName) const
	{
		return string() + "	{\n"
						  "		float oneMinusComp = 1.0 - " + tessCoordComponentName + ";\n"
						  "		" + outputComponentName + " = " + tessCoordComponentName + " + oneMinusComp;\n"
						  "	}\n";
	}